

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,int command)

{
  pointer puVar1;
  uchar __tmp;
  
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(1);
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar1;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar1;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar1 + 1;
  *puVar1 = (uchar)command;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar1 + 1;
  return;
}

Assistant:

MidiMessage::MidiMessage(int command) : vector<uchar>(1, (uchar)command) {
	// do nothing
}